

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib536.c
# Opt level: O1

int perform(CURLM *multi)

{
  undefined8 uVar1;
  int in_EAX;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  int *piVar6;
  char *pcVar7;
  char cVar8;
  timeval tVar9;
  timeval older;
  timeval older_00;
  int maxfd;
  int handles;
  timeval interval;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  int local_1d8;
  int local_1d4;
  undefined8 local_1d0;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  iVar3 = 0;
  do {
    local_1d8 = -99;
    local_1c8.tv_sec = 0;
    local_1c8.tv_usec = 100000;
    iVar2 = curl_multi_perform(multi,&local_1d4);
    uVar1 = _stderr;
    if (iVar2 == 0) {
      if (local_1d4 < 0) {
        curl_mfprintf(_stderr,
                      "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                      ,0x2d);
        iVar3 = 0x7a;
      }
    }
    else {
      uVar4 = curl_multi_strerror(iVar2);
      curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                    ,0x2d,iVar2,uVar4);
      iVar3 = iVar2;
    }
    cVar8 = '\x01';
    iVar2 = iVar3;
    if (iVar3 == 0) {
      tVar9 = tutil_tvnow();
      older.tv_usec = tv_test_start.tv_usec;
      older.tv_sec = tv_test_start.tv_sec;
      lVar5 = tutil_tvdiff(tVar9,older);
      if (lVar5 < 0xea61) {
        if (local_1d4 == 0) {
          iVar3 = 0;
          cVar8 = '\x02';
          iVar2 = in_EAX;
        }
        else {
          local_b8.__fds_bits[0xe] = 0;
          local_b8.__fds_bits[0xf] = 0;
          local_b8.__fds_bits[0xc] = 0;
          local_b8.__fds_bits[0xd] = 0;
          local_b8.__fds_bits[10] = 0;
          local_b8.__fds_bits[0xb] = 0;
          local_b8.__fds_bits[8] = 0;
          local_b8.__fds_bits[9] = 0;
          local_b8.__fds_bits[6] = 0;
          local_b8.__fds_bits[7] = 0;
          local_b8.__fds_bits[4] = 0;
          local_b8.__fds_bits[5] = 0;
          local_b8.__fds_bits[2] = 0;
          local_b8.__fds_bits[3] = 0;
          local_b8.__fds_bits[0] = 0;
          local_b8.__fds_bits[1] = 0;
          local_138.__fds_bits[0] = 0;
          local_138.__fds_bits[1] = 0;
          local_138.__fds_bits[2] = 0;
          local_138.__fds_bits[3] = 0;
          local_138.__fds_bits[4] = 0;
          local_138.__fds_bits[5] = 0;
          local_138.__fds_bits[6] = 0;
          local_138.__fds_bits[7] = 0;
          local_138.__fds_bits[8] = 0;
          local_138.__fds_bits[9] = 0;
          local_138.__fds_bits[10] = 0;
          local_138.__fds_bits[0xb] = 0;
          local_138.__fds_bits[0xc] = 0;
          local_138.__fds_bits[0xd] = 0;
          local_138.__fds_bits[0xe] = 0;
          local_138.__fds_bits[0xf] = 0;
          local_1b8.__fds_bits[0] = 0;
          local_1b8.__fds_bits[1] = 0;
          local_1b8.__fds_bits[2] = 0;
          local_1b8.__fds_bits[3] = 0;
          local_1b8.__fds_bits[4] = 0;
          local_1b8.__fds_bits[5] = 0;
          local_1b8.__fds_bits[6] = 0;
          local_1b8.__fds_bits[7] = 0;
          local_1b8.__fds_bits[8] = 0;
          local_1b8.__fds_bits[9] = 0;
          local_1b8.__fds_bits[10] = 0;
          local_1b8.__fds_bits[0xb] = 0;
          local_1b8.__fds_bits[0xc] = 0;
          local_1b8.__fds_bits[0xd] = 0;
          local_1b8.__fds_bits[0xe] = 0;
          local_1b8.__fds_bits[0xf] = 0;
          iVar3 = curl_multi_fdset(multi,&local_b8,&local_138,&local_1b8,&local_1d8);
          uVar1 = _stderr;
          if (iVar3 == 0) {
            iVar3 = 0;
            if (local_1d8 < -1) {
              curl_mfprintf(_stderr,
                            "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                            ,0x3c);
              iVar3 = 0x7a;
            }
          }
          else {
            uVar4 = curl_multi_strerror(iVar3);
            curl_mfprintf(uVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                          ,0x3c,iVar3,uVar4);
          }
          iVar2 = iVar3;
          if (iVar3 == 0) {
            iVar3 = select_wrapper(local_1d8 + 1,&local_b8,&local_138,&local_1b8,&local_1c8);
            if (iVar3 == -1) {
              piVar6 = __errno_location();
              iVar3 = *piVar6;
              local_1d0 = _stderr;
              pcVar7 = strerror(iVar3);
              curl_mfprintf(local_1d0,"%s:%d select() failed, with errno %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                            ,0x42,iVar3,pcVar7);
              iVar3 = 0x79;
              iVar2 = iVar3;
            }
            else {
              tVar9 = tutil_tvnow();
              older_00.tv_usec = tv_test_start.tv_usec;
              older_00.tv_sec = tv_test_start.tv_sec;
              lVar5 = tutil_tvdiff(tVar9,older_00);
              iVar3 = 0;
              if (60000 < lVar5) {
                curl_mfprintf(_stderr,
                              "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                              ,0x46);
                in_EAX = 0x7d;
                iVar3 = 0x7d;
              }
              cVar8 = 60000 < lVar5;
              iVar2 = in_EAX;
            }
          }
        }
      }
      else {
        curl_mfprintf(_stderr,
                      "%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/mitls[P]mitls-curl/tests/libtest/lib536.c"
                      ,0x31);
        iVar3 = 0x7d;
        iVar2 = iVar3;
      }
    }
    in_EAX = iVar2;
  } while (cVar8 == '\0');
  if (cVar8 == '\x02') {
    in_EAX = 0;
  }
  return in_EAX;
}

Assistant:

static int perform(CURLM *multi)
{
  int handles;
  fd_set fdread, fdwrite, fdexcep;
  int res = 0;

  for(;;) {
    struct timeval interval;
    int maxfd = -99;

    interval.tv_sec = 0;
    interval.tv_usec = 100000L; /* 100 ms */

    res_multi_perform(multi, &handles);
    if(res)
      return res;

    res_test_timedout();
    if(res)
      return res;

    if(!handles)
      break; /* done */

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);

    res_multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);
    if(res)
      return res;

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    res_select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &interval);
    if(res)
      return res;

    res_test_timedout();
    if(res)
      return res;
  }

  return 0; /* success */
}